

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asctime_s.c
# Opt level: O1

int main(void)

{
  int iVar1;
  char *pcVar2;
  tm local_40;
  
  local_40.tm_sec = 0x34;
  local_40.tm_min = 3;
  local_40.tm_hour = 1;
  local_40.tm_mday = 0x10;
  local_40.tm_mon = 8;
  local_40.tm_year = 0x49;
  local_40.tm_wday = 0;
  local_40.tm_yday = 0;
  local_40.tm_isdst = -1;
  pcVar2 = asctime(&local_40);
  iVar1 = strcmp(pcVar2,"Sun Sep 16 01:03:52 1973\n");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/asctime_s.c, line %d - %s\n"
           ,0x37,"strcmp( asctime( &time ), \"Sun Sep 16 01:03:52 1973\\n\" ) == 0");
  }
  local_40.tm_sec = 0;
  local_40.tm_min = 0;
  local_40.tm_hour = 0;
  local_40.tm_mday = 1;
  local_40.tm_mon = 0;
  local_40.tm_year = 0;
  local_40.tm_wday = 0;
  local_40.tm_yday = 0;
  local_40.tm_isdst = -1;
  pcVar2 = asctime(&local_40);
  iVar1 = strcmp(pcVar2,"Sun Jan  1 00:00:00 1900\n");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/asctime_s.c, line %d - %s\n"
           ,0x39,"strcmp( asctime( &time ), \"Sun Jan  1 00:00:00 1900\\n\" ) == 0");
  }
  local_40.tm_sec = 0x3c;
  local_40.tm_min = 0x3b;
  local_40.tm_hour = 0x17;
  local_40.tm_mday = 0x1f;
  local_40.tm_mon = 0xb;
  local_40.tm_year = 0x1fa3;
  local_40.tm_wday = 6;
  local_40.tm_yday = 0;
  local_40.tm_isdst = -1;
  pcVar2 = asctime(&local_40);
  iVar1 = strcmp(pcVar2,"Sat Dec 31 23:59:60 9999\n");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/asctime_s.c, line %d - %s\n"
           ,0x3b,"strcmp( asctime( &time ), \"Sat Dec 31 23:59:60 9999\\n\" ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    /* TODO: Constraint handling */

    struct tm time;
    MKTIME( time, 52, 3, 1, 16, 8, 73, 0, 0 );
    TESTCASE( strcmp( asctime( &time ), "Sun Sep 16 01:03:52 1973\n" ) == 0 );
    MKTIME( time, 0, 0, 0, 1, 0, 0, 0, 0 );
    TESTCASE( strcmp( asctime( &time ), "Sun Jan  1 00:00:00 1900\n" ) == 0 );
    MKTIME( time, 60, 59, 23, 31, 11, 8099, 6, 0 );
    TESTCASE( strcmp( asctime( &time ), "Sat Dec 31 23:59:60 9999\n" ) == 0 );
    return TEST_RESULTS;
}